

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cachedarena.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  char **argv_local;
  int argc_local;
  
  iVar1 = test1();
  if (iVar1 != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x5b);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  argv_local._4_4_ = (uint)(iVar1 != 0);
  return argv_local._4_4_;
}

Assistant:

int
main (int argc, const char* argv[])
{
    ASSERT_EQ (0, test1 ());

    return 0;
}